

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON_Utils.c
# Opt level: O3

uchar * cJSONUtils_strdup(uchar *string)

{
  size_t sVar1;
  void *__dest;
  uchar *puVar2;
  
  sVar1 = strlen((char *)string);
  __dest = (void *)cJSON_malloc(sVar1 + 1);
  if (__dest != (void *)0x0) {
    puVar2 = (uchar *)memcpy(__dest,string,sVar1 + 1);
    return puVar2;
  }
  return (uchar *)0x0;
}

Assistant:

static unsigned char* cJSONUtils_strdup(const unsigned char* const string)
{
    size_t length = 0;
    unsigned char *copy = NULL;

    length = strlen((const char*)string) + sizeof("");
    copy = (unsigned char*) cJSON_malloc(length);
    if (copy == NULL)
    {
        return NULL;
    }
    memcpy(copy, string, length);

    return copy;
}